

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VConst_Serial(sunrealtype c,N_Vector z)

{
  long lVar1;
  long lVar2;
  sunrealtype *zd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  sunrealtype c_local;
  
  lVar1 = *z->content;
  lVar2 = *(long *)((long)z->content + 0x10);
  for (i = 0; i < lVar1; i = i + 1) {
    *(sunrealtype *)(lVar2 + i * 8) = c;
  }
  return;
}

Assistant:

void N_VConst_Serial(sunrealtype c, N_Vector z)
{
  sunindextype i, N;
  sunrealtype* zd;

  zd = NULL;

  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = c; }

  return;
}